

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_f2c_variable.cpp
# Opt level: O0

void adios2_set_operation_parameter_f2c_
               (adios2_variable **variable,int *operation_id,char *key,char *value,int *ierr)

{
  undefined4 uVar1;
  invalid_argument *this;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int *in_RSI;
  undefined8 *in_RDI;
  undefined4 *in_R8;
  
  if (*in_RSI < 0) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this,
               "ERROR: operation_id can\'t be negative, in call to adios2_set_operation_paramter");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar1 = adios2_set_operation_parameter(*in_RDI,(long)*in_RSI,in_RDX,in_RCX);
  *in_R8 = uVar1;
  return;
}

Assistant:

void FC_GLOBAL(adios2_set_operation_parameter_f2c,
               ADIOS2_SET_OPERATION_PARAMETER_F2C)(adios2_variable **variable,
                                                   const int *operation_id, const char *key,
                                                   const char *value, int *ierr)
{
    try
    {
        if (*operation_id < 0)
        {
            throw std::invalid_argument("ERROR: operation_id can't be "
                                        "negative, in call to "
                                        "adios2_set_operation_paramter");
        }

        *ierr = static_cast<int>(adios2_set_operation_parameter(
            *variable, static_cast<std::size_t>(*operation_id), key, value));
    }
    catch (...)
    {
        *ierr =
            static_cast<int>(adios2::helper::ExceptionToError("adios2_set_operation_parameter"));
    }
}